

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queueTest.cpp
# Opt level: O0

void print<ft::queue<int,ft::deque<int,ft::allocator<int>>>>
               (queue<int,_ft::deque<int,_ft::allocator<int>_>_> *t,char *s)

{
  bool bVar1;
  _Setw _Var2;
  ostream *poVar3;
  value_type *pvVar4;
  char *s_local;
  queue<int,_ft::deque<int,_ft::allocator<int>_>_> *t_local;
  
  _Var2 = std::setw(3);
  poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
  poVar3 = std::operator<<(poVar3,s);
  std::operator<<(poVar3," contains:");
  while( true ) {
    bVar1 = ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::empty(t);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    poVar3 = std::operator<<((ostream *)&std::cout,' ');
    pvVar4 = ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::front(t);
    std::ostream::operator<<(poVar3,*pvVar4);
    ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::pop(t);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void	print(T & t, char const * s) {
	std::cout << std::setw(3) << s << " contains:";
	while (!t.empty()) {
		std::cout << ' ' << t.front();
		t.pop();
	}
	std::cout << std::endl;
}